

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O0

bool __thiscall cmGetPropertyCommand::HandleInstallMode(cmGetPropertyCommand *this)

{
  bool bVar1;
  ulong uVar2;
  cmake *this_00;
  ostream *poVar3;
  char *local_248;
  string local_220;
  ostringstream local_200 [8];
  ostringstream e;
  undefined1 local_80 [7];
  bool isSet;
  string value;
  cmInstalledFile *file;
  cmake *cm;
  allocator local_39;
  string local_38;
  cmGetPropertyCommand *local_18;
  cmGetPropertyCommand *this_local;
  
  local_18 = this;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    this_00 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
    value.field_2._8_8_ =
         cmake::GetOrCreateInstalledFile(this_00,(this->super_cmCommand).Makefile,&this->Name);
    if ((cmInstalledFile *)value.field_2._8_8_ == (cmInstalledFile *)0x0) {
      std::__cxx11::ostringstream::ostringstream(local_200);
      poVar3 = std::operator<<((ostream *)local_200,
                               "given INSTALL name that could not be found or created: ");
      std::operator<<(poVar3,(string *)&this->Name);
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream(local_200);
    }
    else {
      std::__cxx11::string::string((string *)local_80);
      bVar1 = cmInstalledFile::GetProperty
                        ((cmInstalledFile *)value.field_2._8_8_,&this->PropertyName,
                         (string *)local_80);
      if (bVar1) {
        local_248 = (char *)std::__cxx11::string::c_str();
      }
      else {
        local_248 = (char *)0x0;
      }
      this_local._7_1_ = StoreResult(this,local_248);
      std::__cxx11::string::~string((string *)local_80);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"not given name for INSTALL scope.",&local_39);
    cmCommand::SetError(&this->super_cmCommand,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGetPropertyCommand::HandleInstallMode()
{
  if(this->Name.empty())
    {
    this->SetError("not given name for INSTALL scope.");
    return false;
    }

  // Get the installed file.
  cmake* cm = this->Makefile->GetCMakeInstance();

  if(cmInstalledFile* file = cm->GetOrCreateInstalledFile(
    this->Makefile, this->Name))
    {
    std::string value;
    bool isSet = file->GetProperty(this->PropertyName, value);

    return this->StoreResult(isSet ? value.c_str() : 0);
    }
  else
    {
    std::ostringstream e;
    e << "given INSTALL name that could not be found or created: "
      << this->Name;
    this->SetError(e.str());
    return false;
    }
}